

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  Color value;
  ostream *poVar1;
  enable_if_t<Color,_optional<std::decay_t<Color>_>,_std::equal_to<void>_> eVar2;
  long *plVar3;
  enable_if_t<Color,_optional<std::decay_t<Color>_>,_magic_enum::detail::case_insensitive<>_> eVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RED",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Color names:",0xc);
  lVar6 = 8;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,*(char **)((long)&DAT_00103cd0 + lVar6),
               *(long *)((long)&__do_global_dtors_aux_fini_array_entry + lVar6));
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  eVar2 = magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0,std::equal_to<void>>
                    (4,"BLUE");
  if (((ulong)eVar2.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> >> 0x20 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BLUE = ",7);
    plVar3 = (long *)std::ostream::operator<<
                               ((ostream *)&std::cout,
                                eVar2.super__Optional_base<Color,_true,_true>._M_payload.
                                super__Optional_payload_base<Color>._M_payload);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  eVar4 = magic_enum::
          enum_cast<Color,(magic_enum::detail::enum_subtype)0,magic_enum::detail::case_insensitive<std::equal_to<void>>>
                    (4,"blue");
  if (((ulong)eVar4.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> & 0x100000000) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BLUE = ",7);
    plVar3 = (long *)std::ostream::operator<<
                               ((ostream *)&std::cout,
                                eVar4.super__Optional_base<Color,_true,_true>._M_payload.
                                super__Optional_payload_base<Color>._M_payload);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GREEN = ",8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,10);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RED = ",6);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-10);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Color: ",7);
  pbVar5 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,RED);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar5," ",1);
  if (((ulong)eVar4.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> & 0x100000000) != 0) {
    pbVar5 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                       (pbVar5,eVar4.super__Optional_base<Color,_true,_true>._M_payload.
                               super__Optional_payload_base<Color>._M_payload);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar5," ",1);
  pbVar5 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     (pbVar5,GREEN);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
  std::ostream::put((char)pbVar5);
  std::ostream::flush();
  plVar3 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Color enum size: ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Color[0] = ",0xb);
  pbVar5 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,RED);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
  std::ostream::put((char)pbVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Colors values:",0xe);
  lVar6 = 0;
  do {
    value = *(Color *)((long)&DAT_00102088 + lVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,value);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  lVar6 = 0;
  do {
    if (*(int *)((long)&magic_enum::detail::
                        values_v<main::Flags,(magic_enum::detail::enum_subtype)0> + lVar6) == 5) {
      std::ostream::put('@');
      goto LAB_00101617;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,5);
LAB_00101617:
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Colors entries:",0xf);
  lVar6 = 0x10;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)((long)&DAT_00103d00 + lVar6),
                        *(long *)(&UNK_00103cf8 + lVar6));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    std::ostream::operator<<(poVar1,*(int *)(&UNK_00103cf0 + lVar6));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  // Enum variable to string name.
  Color c1 = Color::RED;
  auto c1_name = magic_enum::enum_name(c1);
  std::cout << c1_name << std::endl; // RED

  // String enum name sequence.
  constexpr auto names = magic_enum::enum_names<Color>();
  std::cout << "Color names:";
  for (const auto& n : names) {
    std::cout << " " << n;
  }
  std::cout << std::endl;
  // Color names: RED BLUE GREEN

  // String name to enum value.
  auto c2 = magic_enum::enum_cast<Color>("BLUE");
  if (c2.has_value()) {
    std::cout << "BLUE = " << to_integer(c2.value()) << std::endl; // BLUE = 0
  }

  // Case insensitive enum_cast.
  c2 = magic_enum::enum_cast<Color>("blue", magic_enum::case_insensitive);
  if (c2.has_value()) {
    std::cout << "BLUE = " << to_integer(c2.value()) << std::endl; // BLUE = 0
  }

  // Integer value to enum value.
  auto c3 = magic_enum::enum_cast<Color>(10);
  if (c3.has_value()) {
    std::cout << "GREEN = " << magic_enum::enum_integer(c3.value()) << std::endl; // GREEN = 10
  }

  // Enum value to integer value.
  auto c4_integer = magic_enum::enum_integer(Color::RED);
  std::cout << "RED = " << c4_integer << std::endl; // RED = -10

  using magic_enum::iostream_operators::operator<<; // out-of-the-box ostream operator for all enums.
  // Ostream operator for enum.
  std::cout << "Color: " << c1 << " " << c2 << " " << c3 << std::endl; // Color: RED BLUE GREEN

  // Number of enum values.
  std::cout << "Color enum size: " << magic_enum::enum_count<Color>() << std::endl; // Color size: 3

  // Indexed access to enum value.
  std::cout << "Color[0] = " << magic_enum::enum_value<Color>(0) << std::endl; // Color[0] = RED

  // Enum value sequence.
  constexpr auto values = magic_enum::enum_values<Color>();
  std::cout << "Colors values:";
  for (const auto c : values) {
    std::cout << " " << c; // Ostream operator for enum.
  }
  std::cout << std::endl;
  // Color values: RED BLUE GREEN

  enum class Flags { A = 1, B = 2, C = 4, D = 8 };
  using namespace magic_enum::bitwise_operators; // out-of-the-box bitwise operators for all enums.
  // Support operators: ~, |, &, ^, |=, &=, ^=.
  Flags flag = Flags::A | Flags::C;
  std::cout << flag << std::endl; // 5

  enum color { red, green, blue };

  // Checks whether type is an Unscoped enumeration.
  static_assert(magic_enum::is_unscoped_enum_v<color>);
  static_assert(!magic_enum::is_unscoped_enum_v<Color>);
  static_assert(!magic_enum::is_unscoped_enum_v<Flags>);

  // Checks whether type is an Scoped enumeration.
  static_assert(!magic_enum::is_scoped_enum_v<color>);
  static_assert(magic_enum::is_scoped_enum_v<Color>);
  static_assert(magic_enum::is_scoped_enum_v<Flags>);

  // Enum pair (value enum, string enum name) sequence.
  constexpr auto entries = magic_enum::enum_entries<Color>();
  std::cout << "Colors entries:";
  for (const auto& e : entries) {
    std::cout << " "  << e.second << " = " << static_cast<int>(e.first);
  }
  std::cout << std::endl;
  // Color entries: RED = -10 BLUE = 0 GREEN = 10

  return 0;
}